

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Value * __thiscall
soul::AST::TypeMetaFunction::getResultValue(Value *__return_storage_ptr__,TypeMetaFunction *this)

{
  Op op;
  int iVar1;
  Type TStack_38;
  
  iVar1 = (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(this);
  if (((char)iVar1 != '\0') && (op = this->operation, op - size < 0xfffffffa)) {
    getSourceType(&TStack_38,this);
    performOp(__return_storage_ptr__,op,&TStack_38);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_38.structure);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError
            ("isResolved() && ! operationReturnsAType (operation)","getResultValue",0x7e6);
}

Assistant:

Value getResultValue() const
        {
            SOUL_ASSERT (isResolved() && ! operationReturnsAType (operation));
            return performOp (operation, getSourceType());
        }